

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O0

void appendNonbasicColsToBasis(HighsLp *lp,SimplexBasis *basis,HighsInt XnumNewCol)

{
  double dVar1;
  double val;
  value_type vVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  int8_t move;
  double upper;
  double lower;
  HighsInt iCol_1;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt newNumTot;
  HighsInt newNumCol;
  value_type local_39;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_EDX != 0) {
    iVar4 = *in_RDI + in_EDX;
    iVar5 = iVar4 + in_RDI[1];
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(iVar5,in_stack_ffffffffffffffe0),
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(iVar5,in_stack_ffffffffffffffe0),
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar5 = in_RDI[1];
    while (iVar5 = iVar5 + -1, -1 < iVar5) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar5);
      if (*in_RDI <= *pvVar6) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar5);
        *pvVar6 = in_EDX + *pvVar6;
      }
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 1),
                          (long)(*in_RDI + iVar5));
      vVar2 = *pvVar7;
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 1),
                          (long)(iVar4 + iVar5));
      *pvVar7 = vVar2;
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 2),
                          (long)(*in_RDI + iVar5));
      vVar2 = *pvVar7;
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 2),
                          (long)(iVar4 + iVar5));
      *pvVar7 = vVar2;
    }
    for (iVar5 = *in_RDI; iVar5 < iVar4; iVar5 = iVar5 + 1) {
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 1),
                          (long)iVar5);
      *pvVar7 = '\x01';
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar5);
      dVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)iVar5);
      val = *pvVar8;
      if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
        bVar3 = highs_isInfinity(-dVar1);
        if (bVar3) {
          bVar3 = highs_isInfinity(val);
          if (bVar3) {
            local_39 = '\0';
          }
          else {
            local_39 = -1;
          }
        }
        else {
          bVar3 = highs_isInfinity(val);
          if (bVar3) {
            local_39 = '\x01';
          }
          else if (ABS(val) <= ABS(dVar1)) {
            local_39 = -1;
          }
          else {
            local_39 = '\x01';
          }
        }
      }
      else {
        local_39 = '\0';
      }
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 2),
                          (long)iVar5);
      *pvVar7 = local_39;
    }
  }
  return;
}

Assistant:

void appendNonbasicColsToBasis(HighsLp& lp, SimplexBasis& basis,
                               HighsInt XnumNewCol) {
  // Add nonbasic structurals
  if (XnumNewCol == 0) return;
  HighsInt newNumCol = lp.num_col_ + XnumNewCol;
  HighsInt newNumTot = newNumCol + lp.num_row_;
  basis.nonbasicFlag_.resize(newNumTot);
  basis.nonbasicMove_.resize(newNumTot);
  // Shift the row data in basicIndex, nonbasicFlag and nonbasicMove if
  // necessary
  for (HighsInt iRow = lp.num_row_ - 1; iRow >= 0; iRow--) {
    HighsInt iCol = basis.basicIndex_[iRow];
    if (iCol >= lp.num_col_) {
      // This basic variable is a row, so shift its index
      basis.basicIndex_[iRow] += XnumNewCol;
    }
    basis.nonbasicFlag_[newNumCol + iRow] =
        basis.nonbasicFlag_[lp.num_col_ + iRow];
    basis.nonbasicMove_[newNumCol + iRow] =
        basis.nonbasicMove_[lp.num_col_ + iRow];
  }
  // Make any new columns nonbasic
  for (HighsInt iCol = lp.num_col_; iCol < newNumCol; iCol++) {
    basis.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (fabs(lower) < fabs(upper)) {
          move = kNonbasicMoveUp;
        } else {
          move = kNonbasicMoveDn;
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis.nonbasicMove_[iCol] = move;
  }
}